

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.hpp
# Opt level: O0

void __thiscall
pstore::indirect_string::indirect_string
          (indirect_string *this,database *db,
          not_null<const_pstore::sstring_view<const_char_*>_*> str)

{
  sstring_view<const_char_*> *psVar1;
  database *db_local;
  indirect_string *this_local;
  not_null<const_pstore::sstring_view<const_char_*>_*> str_local;
  
  this->db_ = db;
  this->is_pointer_ = true;
  this_local = (indirect_string *)str.ptr_;
  psVar1 = gsl::not_null::operator_cast_to_sstring_view_((not_null *)&this_local);
  (this->field_2).str_ = psVar1;
  psVar1 = gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::get
                     ((not_null<const_pstore::sstring_view<const_char_*>_*> *)&this_local);
  if (((ulong)psVar1 & 1) == 0) {
    return;
  }
  assert_failed("(reinterpret_cast<std::uintptr_t> (str.get ()) & in_heap_mask) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/indirect_string.hpp"
                ,0x3a);
}

Assistant:

constexpr indirect_string (database const & db,
                                   gsl::not_null<raw_sstring_view const *> const str) noexcept
                : db_{db}
                , is_pointer_{true}
                , str_{str} {
            PSTORE_ASSERT ((reinterpret_cast<std::uintptr_t> (str.get ()) & in_heap_mask) == 0);
        }